

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_temp_free_internal_riscv32(TCGContext_conflict9 *s,TCGTemp *ts)

{
  size_t sVar1;
  int iVar2;
  int idx;
  int k;
  TCGTemp *ts_local;
  TCGContext_conflict9 *s_local;
  
  *(ulong *)ts = *(ulong *)ts & 0xffffff7fffffffff;
  sVar1 = temp_idx(s,ts);
  iVar2 = 0;
  if (((uint)((ulong)*(undefined8 *)ts >> 0x26) & 1) != 0) {
    iVar2 = 5;
  }
  set_bit((long)(int)sVar1,
          s->free_temps[(int)(((uint)((ulong)*(undefined8 *)ts >> 0x10) & 0xff) + iVar2)].l);
  return;
}

Assistant:

void tcg_temp_free_internal(TCGContext *s, TCGTemp *ts)
{
    int k, idx;

#if defined(CONFIG_DEBUG_TCG)
    s->temps_in_use--;
    if (s->temps_in_use < 0) {
        fprintf(stderr, "More temporaries freed than allocated!\n");
    }
#endif

    tcg_debug_assert(ts->temp_global == 0);
    tcg_debug_assert(ts->temp_allocated != 0);
    ts->temp_allocated = 0;

    idx = temp_idx(s, ts);
    k = ts->base_type + (ts->temp_local ? TCG_TYPE_COUNT : 0);
    set_bit(idx, s->free_temps[k].l);
}